

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::IRContext::ProcessCallTreeFromRoots
          (IRContext *this,ProcessFunction *pfn,
          queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *roots)

{
  _Elt_pointer puVar1;
  bool bVar2;
  Function *__args;
  bool bVar3;
  IRContext *this_00;
  __ireturn_type _Var4;
  uint32_t fi;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  done;
  uint local_74;
  IRContext *local_70;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  bVar3 = false;
  local_70 = (IRContext *)pfn;
  while( true ) {
    do {
      puVar1 = (roots->c).super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur;
      if ((roots->c).super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Deque_impl_data._M_finish._M_cur == puVar1) {
        std::
        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable(&local_68);
        return bVar3;
      }
      local_74 = *puVar1;
      std::deque<unsigned_int,_std::allocator<unsigned_int>_>::pop_front(&roots->c);
      _Var4 = std::__detail::
              _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::insert((_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        *)&local_68,&local_74);
    } while (((undefined1  [16])_Var4 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
    __args = GetFunction(this,local_74);
    if (__args == (Function *)0x0) break;
    this_00 = local_70;
    bVar2 = std::function<bool_(spvtools::opt::Function_*)>::operator()
                      ((function<bool_(spvtools::opt::Function_*)> *)local_70,__args);
    bVar3 = (bool)(bVar3 | bVar2);
    AddCalls(this_00,__args,roots);
  }
  __assert_fail("fn && \"Trying to process a function that does not exist.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/ir_context.cpp"
                ,0x3d8,
                "bool spvtools::opt::IRContext::ProcessCallTreeFromRoots(ProcessFunction &, std::queue<uint32_t> *)"
               );
}

Assistant:

bool IRContext::ProcessCallTreeFromRoots(ProcessFunction& pfn,
                                         std::queue<uint32_t>* roots) {
  // Process call tree
  bool modified = false;
  std::unordered_set<uint32_t> done;

  while (!roots->empty()) {
    const uint32_t fi = roots->front();
    roots->pop();
    if (done.insert(fi).second) {
      Function* fn = GetFunction(fi);
      assert(fn && "Trying to process a function that does not exist.");
      modified = pfn(fn) || modified;
      AddCalls(fn, roots);
    }
  }
  return modified;
}